

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O2

RK_S32 __thiscall mpp_list::add_by_key(mpp_list *this,void *data,RK_S32 size,RK_U32 *key)

{
  mpp_list_node *pmVar1;
  mpp_list_node *pmVar2;
  RK_U32 key_00;
  RK_U32 RVar3;
  mpp_list_node *pmVar4;
  RK_S32 RVar5;
  
  key_00 = keys;
  RVar5 = 0;
  if (this->head != (mpp_list_node *)0x0) {
    RVar3 = keys + 1;
    *key = keys;
    keys = RVar3;
    pmVar4 = create_list(data,size,key_00);
    if (pmVar4 == (mpp_list_node *)0x0) {
      RVar5 = -0xc;
    }
    else {
      pmVar1 = this->head;
      pmVar2 = pmVar1->prev;
      pmVar1->prev = pmVar4;
      pmVar4->next = pmVar1;
      pmVar4->prev = pmVar2;
      pmVar2->next = pmVar4;
      this->count = this->count + 1;
    }
  }
  return RVar5;
}

Assistant:

RK_S32 mpp_list::add_by_key(void *data, RK_S32 size, RK_U32 *key)
{
    RK_S32 ret = 0;
    if (head) {
        RK_U32 list_key = get_key();
        *key = list_key;
        mpp_list_node *node = create_list(data, size, list_key);
        if (node) {
            mpp_list_add_tail(node, head);
            count++;
            ret = 0;
        } else {
            ret = -ENOMEM;
        }
    }
    return ret;
}